

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup.cpp
# Opt level: O1

QDebug operator<<(QDebug *d,QDnsLookupRunnable *r)

{
  QTextStream *pQVar1;
  Stream *pSVar2;
  bool bVar3;
  ushort uVar4;
  void *pvVar5;
  ushort uVar6;
  long in_RDX;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QString local_78;
  QDebug local_60;
  QDebug local_58;
  QByteArray local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArray::left(&local_50,(QByteArray *)(in_RDX + 0x20),0xff);
  if (local_50.d.ptr == (char *)0x0) {
    local_50.d.ptr = (char *)&QByteArray::_empty;
  }
  QDebug::putByteArray((char *)r,(ulong)local_50.d.ptr,(Latin1Content)local_50.d.size);
  if ((*(QTextStream **)r)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)r,' ');
  }
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (0xff < *(ulong *)(in_RDX + 0x30)) {
    pQVar1 = *(QTextStream **)r;
    QVar7.m_data = (storage_type *)0xf;
    QVar7.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar7);
    QTextStream::operator<<(pQVar1,(QString *)&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((*(QTextStream **)r)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)r,' ');
    }
  }
  pQVar1 = *(QTextStream **)r;
  QVar8.m_data = &DAT_00000006;
  QVar8.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar8);
  QTextStream::operator<<(pQVar1,(QString *)&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((*(QTextStream **)r)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)r,' ');
  }
  local_60.stream = *(Stream **)r;
  *(int *)(local_60.stream + 0x28) = *(int *)(local_60.stream + 0x28) + 1;
  qt_QMetaEnum_debugOperator
            (&local_58,(longlong)&local_60,(QMetaObject *)(ulong)*(uint *)(in_RDX + 0x40),
             (char *)&QDnsLookup::staticMetaObject);
  QDebug::~QDebug(&local_58);
  QDebug::~QDebug(&local_60);
  bVar3 = QHostAddress::isNull((QHostAddress *)(in_RDX + 0x38));
  if (!bVar3) {
    pQVar1 = *(QTextStream **)r;
    QVar9.m_data = (storage_type *)0xf;
    QVar9.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar9);
    QTextStream::operator<<(pQVar1,(QString *)&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((*(QTextStream **)r)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)r,' ');
    }
    QHostAddress::toString(&local_78,(QHostAddress *)(in_RDX + 0x38));
    pvVar5 = (void *)QString::utf16();
    QTextStream::operator<<(*(QTextStream **)r,pvVar5);
    if ((*(QTextStream **)r)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)r,' ');
    }
    pQVar1 = *(QTextStream **)r;
    QVar10.m_data = &DAT_00000006;
    QVar10.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar10);
    QTextStream::operator<<(pQVar1,(QString *)&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((*(QTextStream **)r)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)r,' ');
    }
    uVar4 = *(ushort *)(in_RDX + 0x44);
    if (*(ushort *)(in_RDX + 0x44) == 0) {
      uVar6 = 0x355;
      if (*(char *)(in_RDX + 0x46) != '\x01') {
        uVar6 = 0;
      }
      uVar4 = 0x35;
      if (*(char *)(in_RDX + 0x46) != '\0') {
        uVar4 = uVar6;
      }
    }
    QTextStream::operator<<(*(QTextStream **)r,uVar4);
    if ((*(QTextStream **)r)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)r,' ');
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(char *)(in_RDX + 0x46) == '\x01') {
      pQVar1 = *(QTextStream **)r;
      QVar11.m_data = &DAT_00000006;
      QVar11.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar11);
      QTextStream::operator<<(pQVar1,(QString *)&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((*(QTextStream **)r)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)r,' ');
      }
    }
  }
  pSVar2 = *(Stream **)r;
  d->stream = pSVar2;
  pSVar2 = pSVar2 + 0x28;
  *(int *)pSVar2 = *(int *)pSVar2 + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)(Stream *)d;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug operator<<(QDebug &d, QDnsLookupRunnable *r)
{
    // continued: print the information about the request
    d << r->requestName.left(MaxDomainNameLength);
    if (r->requestName.size() > MaxDomainNameLength)
        d << "... (truncated)";
    d << " type " << r->requestType;
    if (!r->nameserver.isNull()) {
        d << " to nameserver " << qUtf16Printable(r->nameserver.toString())
          << " port " << (r->port ? r->port : QDnsLookup::defaultPortForProtocol(r->protocol));
        switch (r->protocol) {
        case QDnsLookup::Standard:
            break;
        case QDnsLookup::DnsOverTls:
            d << " (TLS)";
        }
    }
    return d;
}